

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void models_free(void)

{
  if (adapt_am != (adapt_am_t *)0x0) {
    adapt_am_free(adapt_am);
  }
  if (fastgmm != (fast_gmm_t *)0x0) {
    fast_gmm_free(fastgmm);
  }
  if (ascr != (ascr_t *)0x0) {
    ascr_free(ascr);
  }
  if (dict != (dict_t *)0x0) {
    dict_free(dict);
  }
  kbcore_free(kbc);
  return;
}

Assistant:

static void models_free(void)
{
    if (adapt_am)
        adapt_am_free(adapt_am);
    if (fastgmm)
        fast_gmm_free(fastgmm);
    if (ascr)
        ascr_free(ascr);
    if (dict)
        dict_free(dict);

    kbcore_free(kbc);
}